

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarReader.cpp
# Opt level: O1

bool ZXing::OneD::IsCharacterPair(PatternView v,int modsLeft,int modsRight)

{
  ulong uVar1;
  ushort uVar2;
  long lVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar8;
  short sVar9;
  undefined1 auVar7 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  lVar3 = 0x10;
  uVar2 = 0;
  do {
    uVar2 = uVar2 + *(short *)((long)v._data + lVar3);
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0x1a);
  sVar8 = v._data[6] + v._data[2];
  sVar9 = v._data[7] + v._data[3];
  sVar4 = sVar9 + v._data[5] + v._data[1];
  sVar5 = sVar9 + v._data[5] * 2;
  sVar6 = sVar9 + v._data[7] * 2;
  auVar7._0_2_ = sVar4 + sVar8 + v._data[4] + *v._data;
  auVar7._2_2_ = sVar4;
  auVar7._4_2_ = 0;
  auVar7._6_2_ = sVar9 * 2;
  auVar7._8_2_ = sVar5 + sVar8 + v._data[4] * 2;
  auVar7._10_2_ = sVar5;
  auVar7._12_2_ = sVar6 + sVar8 + v._data[6] * 2;
  auVar7._14_2_ = sVar6;
  auVar7 = auVar7 & _DAT_00198970;
  uVar1 = auVar7._0_8_ & 0xffff0000ffffffff;
  auVar10._0_4_ = (float)(int)uVar1;
  auVar10._4_4_ = (float)(int)((uint)(uVar1 >> 0x20) | (uint)uVar2);
  auVar10._8_4_ = (float)auVar7._8_4_;
  auVar10._12_4_ = (float)auVar7._12_4_;
  auVar11._0_4_ = (float)modsLeft;
  auVar11._4_4_ = 0x41700000;
  auVar11._8_8_ = 0;
  auVar11 = divps(auVar10,auVar11);
  if (ABS(auVar11._0_4_ / auVar11._4_4_ + -1.0) < 0.1) {
    return ABS(((float)(ushort)(v._data[0x14] + v._data[0x10] + v._data[0x12] + v._data[0xe] +
                               v._data[0x13] + v._data[0xf] + v._data[0x11] + v._data[0xd]) /
               (float)modsRight) / auVar11._4_4_ + -1.0) < 0.1;
  }
  return false;
}

Assistant:

static bool IsCharacterPair(PatternView v, int modsLeft, int modsRight)
{
	float modSizeRef = ModSizeFinder(v);
	return IsCharacter(LeftChar(v), modsLeft, modSizeRef) && IsCharacter(RightChar(v), modsRight, modSizeRef);
}